

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::ComputeShape
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZVec<double> *qsi,TPZMaterialData *data)

{
  int iVar1;
  double value;
  pair<int,_int> pVar2;
  TPZFNMatrix<20,_double> *this_00;
  long in_RDX;
  undefined8 in_RSI;
  TPZFMatrix<double> *in_RDI;
  TPZFNMatrix<9,_double> gradx;
  int i;
  int shapeSize;
  TPZFMatrix<double> phiMaster;
  TPZShapeData *shapedata;
  int nshape;
  int dim;
  size_t in_stack_00000228;
  char *in_stack_00000230;
  int *in_stack_fffffffffffffe08;
  TPZCompEl *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe38;
  int iVar3;
  TPZFMatrix<double> *in_stack_fffffffffffffe40;
  int64_t in_stack_fffffffffffffe48;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffe50;
  TPZFMatrix<double> *in_stack_fffffffffffffe68;
  TPZFMatrix<double> *in_stack_fffffffffffffe70;
  TPZShapeData *in_stack_fffffffffffffe78;
  TPZVec<double> *in_stack_fffffffffffffe80;
  TPZFMatrix<double> *in_stack_fffffffffffffe88;
  int in_stack_ffffffffffffff14;
  double in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int iVar4;
  undefined4 in_stack_ffffffffffffff3c;
  TPZFMatrix<double> *in_stack_ffffffffffffff40;
  TPZFMatrix<double> *in_stack_ffffffffffffff58;
  TPZFMatrix<double> *in_stack_ffffffffffffff60;
  TPZShapeData *in_stack_ffffffffffffff68;
  TPZVec<double> *in_stack_ffffffffffffff70;
  
  (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x4b])()
  ;
  TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffffe40);
  iVar3 = (int)in_RDI[1].fSize;
  if (iVar3 == 0) {
    TPZShapeHDiv<pzshape::TPZShapeLinear>::Shape
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68);
  }
  else if (iVar3 == 1) {
    TPZFMatrix<double>::Resize
              (in_stack_fffffffffffffe88,(int64_t)in_stack_fffffffffffffe80,
               (int64_t)in_stack_fffffffffffffe78);
    TPZFMatrix<double>::Resize
              (in_stack_fffffffffffffe88,(int64_t)in_stack_fffffffffffffe80,
               (int64_t)in_stack_fffffffffffffe78);
    TPZShapeHDivConstant<pzshape::TPZShapeLinear>::Shape
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
  }
  else {
    pzinternal::DebugStopImpl(in_stack_00000230,in_stack_00000228);
  }
  value = (double)TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDX + 0x3cb0));
  iVar1 = SUB84(value,0);
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pVar2 = std::make_pair<int&,int&>(in_stack_fffffffffffffe08,(int *)0x19f8a1c);
    in_stack_ffffffffffffff2c = pVar2.first;
    in_stack_ffffffffffffff30 = pVar2.second;
    in_stack_fffffffffffffe18 =
         (TPZCompEl *)
         TPZVec<std::pair<int,_long>_>::operator[]
                   ((TPZVec<std::pair<int,_long>_> *)(in_RDX + 0x42c0),(long)iVar4);
    std::pair<int,long>::operator=
              ((pair<int,long> *)in_stack_fffffffffffffe18,
               (pair<int,_int> *)&stack0xffffffffffffff2c);
  }
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,0,
             (double *)CONCAT44(iVar3,in_stack_fffffffffffffe38));
  this_00 = (TPZFNMatrix<20,_double> *)TPZCompEl::Reference(in_stack_fffffffffffffe18);
  (*(this_00->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable
    ._vptr_TPZSavable[0x46])(this_00,in_RSI,&stack0xfffffffffffffe48);
  TPZFMatrix<double>::MultAdd
            (in_stack_ffffffffffffff40,
             (TPZFMatrix<double> *)CONCAT44(in_stack_ffffffffffffff3c,iVar1),
             (TPZFMatrix<double> *)CONCAT44(iVar4,in_stack_ffffffffffffff30),
             (TPZFMatrix<double> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  TPZFMatrix<double>::operator*=(in_RDI,value);
  TPZFNMatrix<20,_double>::operator=(this_00,(double)in_stack_fffffffffffffe08);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x19f8b7c);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x19f8b89);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::ComputeShape(TPZVec<REAL> &qsi, TPZMaterialData &data) {

    constexpr int dim = TSHAPE::Dimension;
    const int nshape = this->NShapeF();
    TPZShapeData &shapedata = data;
    TPZFMatrix<REAL> phiMaster;

    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        TPZShapeHDiv<TSHAPE>::Shape(qsi, shapedata, phiMaster, data.divphi);
        break;

    case HDivFamily::EHDivConstant:
        phiMaster.Resize(TSHAPE::Dimension,nshape);
        data.divphi.Resize(nshape,1);
        TPZShapeHDivConstant<TSHAPE>::Shape(qsi, shapedata, phiMaster, data.divphi);
        break;

    default:
        DebugStop();
        break;
    }

    //This is for legacy material classes - will be deleted in the future
    int shapeSize = data.divphi.Rows();

    for (int i = 0; i < shapeSize; i++){
        data.fVecShapeIndex[i] = make_pair(i,i);
    }
    //
    
    TPZFNMatrix<9,REAL> gradx(3,TSHAPE::Dimension,0.);
    this->Reference()->GradX(qsi, gradx);
    gradx.MultAdd(phiMaster,data.fDeformedDirections,data.fDeformedDirections,1./fabs(data.detjac));
    data.divphi *= 1/fabs(data.detjac);
    data.phi = 1.;

}